

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_time.c
# Opt level: O0

timeval * zt_diff_time(timeval *dt,timeval *t1,timeval *t2)

{
  timeval *t2_local;
  timeval *t1_local;
  timeval *dt_local;
  
  dt->tv_sec = t2->tv_sec - t1->tv_sec;
  dt->tv_usec = t2->tv_usec - t1->tv_usec;
  while (dt->tv_usec < 0) {
    dt->tv_usec = dt->tv_usec + 1000000;
    dt->tv_sec = dt->tv_sec + -1;
  }
  return dt;
}

Assistant:

struct timeval *
zt_diff_time(struct timeval *dt, struct timeval *t1, struct timeval *t2)
{
    dt->tv_sec = t2->tv_sec - t1->tv_sec;
    dt->tv_usec = t2->tv_usec - t1->tv_usec;

    while (dt->tv_usec < 0) {
        dt->tv_usec += 1000000;
        dt->tv_sec -= 1;
    }
    return dt;
}